

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool *this;
  string local_398;
  string local_378 [8];
  string input;
  Options local_348;
  undefined1 local_2a0 [8];
  CompileContext context;
  Options options;
  char **argv_local;
  int argc_local;
  
  this = &context.m_parser.m_hadError;
  enact::Options::Options((Options *)this,argc,argv);
  enact::Options::Options(&local_348,(Options *)this);
  enact::CompileContext::CompileContext((CompileContext *)local_2a0,&local_348);
  enact::Options::~Options(&local_348);
  do {
    std::operator<<((ostream *)&std::cout,"enact > ");
    std::__cxx11::string::string(local_378);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_378);
    std::__cxx11::string::string((string *)&local_398,local_378);
    enact::CompileContext::compile((CompileContext *)local_2a0,&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string(local_378);
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
    //enact::Options options{argc, argv};
    //enact::CompileContext context{options};

    //return static_cast<int>(context.run());

    enact::Options options{argc, argv};
    enact::CompileContext context{options};

    while (true) {
        std::cout << "enact > ";
        std::string input;
        std::getline(std::cin, input);

        context.compile(input);
    }
}